

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O0

void __thiscall QEvdevTabletData::report(QEvdevTabletData *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  qint64 qVar12;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  qreal pressure;
  int pressureRange;
  int pointer;
  qreal ny;
  qreal nx;
  QPointF globalPos;
  QRect winRect;
  undefined4 in_stack_ffffffffffffff28;
  MouseButton in_stack_ffffffffffffff2c;
  QFlags<Qt::MouseButton> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff3c;
  double local_a0;
  int local_5c;
  uint local_3c;
  QPointF local_38;
  QPointF local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(in_RDI + 0xc) == 0) && (*(int *)((long)in_RDI + 0x5c) != 0)) {
    iVar1 = *(int *)((long)in_RDI + 0x5c);
    qVar12 = QEvdevTabletHandler::deviceId((QEvdevTabletHandler *)*in_RDI);
    QWindowSystemInterface::handleTabletEnterProximityEvent(0x10,iVar1,qVar12);
  }
  iVar1 = *(int *)(in_RDI + 9);
  iVar2 = *(int *)(in_RDI + 5);
  iVar3 = *(int *)(in_RDI + 7);
  iVar4 = *(int *)(in_RDI + 5);
  iVar5 = *(int *)((long)in_RDI + 0x4c);
  iVar6 = *(int *)((long)in_RDI + 0x2c);
  iVar7 = *(int *)((long)in_RDI + 0x3c);
  iVar8 = *(int *)((long)in_RDI + 0x2c);
  local_18._0_8_ = 0xaaaaaaaaaaaaaaaa;
  local_18._8_8_ = 0xaaaaaaaaaaaaaaaa;
  QGuiApplication::primaryScreen();
  local_18 = QScreen::geometry();
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  iVar9 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  iVar10 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  QPointF::QPointF(&local_28,((double)(iVar1 - iVar2) / (double)(iVar3 - iVar4)) * (double)iVar9,
                   ((double)(iVar5 - iVar6) / (double)(iVar7 - iVar8)) * (double)iVar10);
  local_5c = *(int *)((long)in_RDI + 0x5c);
  if (((*(byte *)(in_RDI + 0xb) & 1) == 0) && ((*(byte *)((long)in_RDI + 0x59) & 1) != 0)) {
    local_28.xp = (qreal)in_RDI[0xd];
    local_28.yp = (qreal)in_RDI[0xe];
    local_5c = *(int *)(in_RDI + 0xc);
  }
  if (*(int *)(in_RDI + 8) - *(int *)(in_RDI + 6) == 0) {
    local_a0 = 1.0;
  }
  else {
    local_a0 = (double)(*(int *)(in_RDI + 10) - *(int *)(in_RDI + 6)) /
               (double)(*(int *)(in_RDI + 8) - *(int *)(in_RDI + 6));
  }
  if (((*(byte *)(in_RDI + 0xb) & 1) != 0) || ((*(byte *)((long)in_RDI + 0x59) & 1) != 0)) {
    QPointF::QPointF(&local_38);
    QFlags<Qt::MouseButton>::QFlags(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    qVar12 = QEvdevTabletHandler::deviceId((QEvdevTabletHandler *)*in_RDI);
    QCoreApplication::instance();
    uVar11 = QGuiApplication::keyboardModifiers();
    QWindowSystemInterface::handleTabletEvent
              ((QWindow *)0x0,(QPointF *)&local_38,(QPointF *)&local_28,0x10,local_5c,
               (QFlags *)(ulong)local_3c,local_a0,0.0,0.0,0.0,0.0,0,qVar12,
               (QFlags *)CONCAT44(in_stack_ffffffffffffff3c,uVar11));
  }
  if ((*(int *)(in_RDI + 0xc) != 0) && (*(int *)((long)in_RDI + 0x5c) == 0)) {
    iVar1 = *(int *)((long)in_RDI + 0x5c);
    qVar12 = QEvdevTabletHandler::deviceId((QEvdevTabletHandler *)*in_RDI);
    QWindowSystemInterface::handleTabletLeaveProximityEvent(0x10,iVar1,qVar12);
  }
  *(byte *)((long)in_RDI + 0x59) = *(byte *)(in_RDI + 0xb) & 1;
  *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)((long)in_RDI + 0x5c);
  *(undefined4 *)(in_RDI + 0xd) = local_28.xp._0_4_;
  *(undefined4 *)((long)in_RDI + 0x6c) = local_28.xp._4_4_;
  *(undefined4 *)(in_RDI + 0xe) = local_28.yp._0_4_;
  *(undefined4 *)((long)in_RDI + 0x74) = local_28.yp._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTabletData::report()
{
    if (!state.lastReportTool && state.tool)
        QWindowSystemInterface::handleTabletEnterProximityEvent(int(QInputDevice::DeviceType::Stylus), state.tool, q->deviceId());

    qreal nx = (state.x - minValues.x) / qreal(maxValues.x - minValues.x);
    qreal ny = (state.y - minValues.y) / qreal(maxValues.y - minValues.y);

    QRect winRect = QGuiApplication::primaryScreen()->geometry();
    QPointF globalPos(nx * winRect.width(), ny * winRect.height());
    int pointer = state.tool;
    // Prevent sending confusing values of 0 when moving the pen outside the active area.
    if (!state.down && state.lastReportDown) {
        globalPos = state.lastReportPos;
        pointer = state.lastReportTool;
    }

    int pressureRange = maxValues.p - minValues.p;
    qreal pressure = pressureRange ? (state.p - minValues.p) / qreal(pressureRange) : qreal(1);

    if (state.down || state.lastReportDown) {
        QWindowSystemInterface::handleTabletEvent(0, QPointF(), globalPos,
                                                  int(QInputDevice::DeviceType::Stylus), pointer,
                                                  state.down ? Qt::LeftButton : Qt::NoButton,
                                                  pressure, 0, 0, 0, 0, 0, q->deviceId(),
                                                  qGuiApp->keyboardModifiers());
    }

    if (state.lastReportTool && !state.tool)
        QWindowSystemInterface::handleTabletLeaveProximityEvent(int(QInputDevice::DeviceType::Stylus), state.tool, q->deviceId());

    state.lastReportDown = state.down;
    state.lastReportTool = state.tool;
    state.lastReportPos = globalPos;
}